

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalFileLog.cpp
# Opt level: O0

double ApprovalFileLog::log(double __x)

{
  ostream *this;
  string *in_RDI;
  double dVar1;
  ofstream ofs;
  string local_228 [32];
  ostream local_208;
  string *local_8;
  
  local_8 = in_RDI;
  initialize();
  getLogFilePath_abi_cxx11_();
  std::ofstream::ofstream(&local_208,local_228,_S_app);
  std::__cxx11::string::~string(local_228);
  this = std::operator<<(&local_208,local_8);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  dVar1 = (double)std::ofstream::~ofstream(&local_208);
  return dVar1;
}

Assistant:

void ApprovalFileLog::log(const std::string& filePath)
{
    initialize();
    std::ofstream ofs(getLogFilePath(), std::ios::app);
    ofs << filePath << std::endl;
}